

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::basic_csv_cursor<char,jsoncons::string_source<char>,std::allocator<char>>::
basic_csv_cursor<std::__cxx11::string_const&>
          (basic_csv_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source,
          basic_csv_decode_options<char> *options,
          function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *err_handler,
          allocator<char> *alloc,type *param_6)

{
  string_view_type sv_00;
  basic_staj_visitor<char> *in_RDX;
  string *in_RSI;
  basic_staj_cursor<char> *in_RDI;
  char *in_R9;
  basic_string_view<char,_std::char_traits<char>_> sv;
  allocator<char> *in_stack_000001f8;
  function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *in_stack_00000200;
  basic_csv_decode_options<char> *in_stack_00000208;
  basic_csv_parser<char,_std::allocator<char>_> *in_stack_00000210;
  text_source_adaptor<jsoncons::string_source<char>_> *in_stack_ffffffffffffff50;
  basic_csv_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_>
  *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  
  ser_context::ser_context((ser_context *)(in_RDI + 0x51));
  basic_staj_cursor<char>::basic_staj_cursor(in_RDI);
  in_RDI->_vptr_basic_staj_cursor = (_func_int **)(vtable + 0x18);
  in_RDI[0x51]._vptr_basic_staj_cursor = (_func_int **)(vtable + 0xb8);
  text_source_adaptor<jsoncons::string_source<char>_>::text_source_adaptor
            (in_stack_ffffffffffffff50);
  std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::function
            ((function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)in_RDX,
             (function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)(in_RDI + 5)
            );
  basic_csv_parser<char,_std::allocator<char>_>::basic_csv_parser
            (in_stack_00000210,in_stack_00000208,in_stack_00000200,in_stack_000001f8);
  std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::~function
            ((function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)0x42b10b);
  basic_staj_visitor<char>::basic_staj_visitor(in_RDX);
  basic_csv_parser<char,_std::allocator<char>_>::cursor_mode
            ((basic_csv_parser<char,_std::allocator<char>_> *)(in_RDI + 5),true);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_RSI);
  sv_00._M_str = in_R9;
  sv_00._M_len = in_stack_ffffffffffffffc8;
  basic_csv_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_>::
  initialize_with_string_view(in_stack_ffffffffffffffc0,sv_00);
  return;
}

Assistant:

basic_csv_cursor(Sourceable&& source, 
        const basic_csv_decode_options<CharT>& options = basic_csv_decode_options<CharT>(),
        std::function<bool(csv_errc,const ser_context&)> err_handler = default_csv_parsing(),
        const Allocator& alloc = Allocator(),
        typename std::enable_if<std::is_constructible<jsoncons::basic_string_view<CharT>,Sourceable>::value>::type* = 0)
       : source_(),
         parser_(options,err_handler,alloc)
    {
        parser_.cursor_mode(true);
        jsoncons::basic_string_view<CharT> sv(std::forward<Sourceable>(source));
        initialize_with_string_view(sv);
    }